

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::AJoint::Solve(AJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  float fVar1;
  undefined8 uVar2;
  btRigidBody *pbVar3;
  Cluster *pCVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Impulse i;
  Impulse local_78;
  Impulse local_48;
  
  this_00 = (this->super_Joint).m_bodies;
  pbVar3 = (this->super_Joint).m_bodies[0].m_rigid;
  if (pbVar3 == (btRigidBody *)0x0) {
    pCVar4 = this_00->m_soft;
    if (pCVar4 == (Cluster *)0x0) {
      fVar9 = 0.0;
      fVar10 = 0.0;
      fVar7 = 0.0;
    }
    else {
      uVar2 = *(undefined8 *)(pCVar4->m_av).m_floats;
      fVar9 = (float)uVar2;
      fVar10 = (float)((ulong)uVar2 >> 0x20);
      fVar7 = (float)*(undefined8 *)((pCVar4->m_av).m_floats + 2);
    }
  }
  else {
    uVar2 = *(undefined8 *)(pbVar3->m_angularVelocity).m_floats;
    fVar9 = (float)uVar2;
    fVar10 = (float)((ulong)uVar2 >> 0x20);
    fVar7 = (float)*(undefined8 *)((pbVar3->m_angularVelocity).m_floats + 2);
  }
  this_01 = (this->super_Joint).m_bodies + 1;
  pbVar3 = (this->super_Joint).m_bodies[1].m_rigid;
  if (pbVar3 == (btRigidBody *)0x0) {
    pCVar4 = this_01->m_soft;
    if (pCVar4 == (Cluster *)0x0) {
      fVar11 = 0.0;
      fVar8 = 0.0;
      fVar12 = 0.0;
    }
    else {
      uVar2 = *(undefined8 *)(pCVar4->m_av).m_floats;
      fVar11 = (float)uVar2;
      fVar8 = (float)((ulong)uVar2 >> 0x20);
      fVar12 = (float)*(undefined8 *)((pCVar4->m_av).m_floats + 2);
    }
  }
  else {
    uVar2 = *(undefined8 *)(pbVar3->m_angularVelocity).m_floats;
    fVar11 = (float)uVar2;
    fVar8 = (float)((ulong)uVar2 >> 0x20);
    fVar12 = (float)*(undefined8 *)((pbVar3->m_angularVelocity).m_floats + 2);
  }
  fVar6 = (float)(**(code **)(*(long *)this->m_icontrol + 0x18))
                           (this->m_axis[0].m_floats[2] * (fVar7 - fVar12) +
                            this->m_axis[0].m_floats[0] * (fVar9 - fVar11) +
                            this->m_axis[0].m_floats[1] * (fVar10 - fVar8),this->m_icontrol,this);
  local_48.m_drift.m_floats[0] = 0.0;
  local_48.m_drift.m_floats[1] = 0.0;
  local_48.m_drift.m_floats[2] = 0.0;
  local_48.m_drift.m_floats[3] = 0.0;
  local_48._32_1_ = 1;
  fVar1 = (this->super_Joint).m_cfm;
  fVar11 = ((fVar9 - fVar11) - this->m_axis[0].m_floats[0] * fVar6) * fVar1 +
           (this->super_Joint).m_drift.m_floats[0];
  fVar9 = ((fVar10 - fVar8) - this->m_axis[0].m_floats[1] * fVar6) * fVar1 +
          (this->super_Joint).m_drift.m_floats[1];
  fVar12 = ((fVar7 - fVar12) - fVar6 * this->m_axis[0].m_floats[2]) * fVar1 +
           (this->super_Joint).m_drift.m_floats[2];
  fVar7 = ((this->super_Joint).m_massmatrix.m_el[2].m_floats[2] * fVar12 +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] * fVar11 +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] * fVar9) * sor;
  fVar10 = sor * (fVar12 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
                 fVar11 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
                 (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * fVar9);
  fVar9 = sor * (fVar12 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                fVar11 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
                (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * fVar9);
  local_48.m_velocity.m_floats[2] = fVar7;
  local_48.m_velocity.m_floats[0] = fVar10;
  local_48.m_velocity.m_floats[1] = fVar9;
  local_48.m_velocity.m_floats[3] = 0.0;
  local_78._32_4_ = local_48._32_4_;
  uVar5 = CONCAT44(fVar9,fVar10) ^ 0x8000000080000000;
  local_78.m_velocity.m_floats[2] = -fVar7;
  local_78.m_velocity.m_floats[0] = (btScalar)(int)uVar5;
  local_78.m_velocity.m_floats[1] = (btScalar)(int)(uVar5 >> 0x20);
  local_78.m_velocity.m_floats[3] = 0.0;
  local_78.m_drift.m_floats[2] = -0.0;
  local_78.m_drift.m_floats[0] = -0.0;
  local_78.m_drift.m_floats[1] = -0.0;
  local_78.m_drift.m_floats[3] = 0.0;
  Body::applyAImpulse(this_00,&local_78);
  Body::applyAImpulse(this_01,&local_48);
  return;
}

Assistant:

void				btSoftBody::AJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].angularVelocity();
	const btVector3		vb=m_bodies[1].angularVelocity();
	const btVector3		vr=va-vb;
	const btScalar		sp=btDot(vr,m_axis[0]);
	const btVector3		vc=vr-m_axis[0]*m_icontrol->Speed(this,sp);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vc*m_cfm)*sor;
	m_bodies[0].applyAImpulse(-impulse);
	m_bodies[1].applyAImpulse( impulse);
}